

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O0

string * license::print_for_sign
                   (string *__return_storage_ptr__,string *feature_name,TKeyVal *section)

{
  char *pcVar1;
  TKeyVal *this;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  locale *in_RCX;
  undefined1 local_290 [16];
  string local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator local_211;
  undefined1 local_210 [8];
  string key;
  _Self local_1e8;
  const_iterator it;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [8];
  stringstream buf;
  ostream local_198 [376];
  TKeyVal *local_20;
  TKeyVal *section_local;
  string *feature_name_local;
  
  local_20 = section;
  section_local = (TKeyVal *)feature_name;
  feature_name_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  this = section_local;
  std::locale::locale((locale *)local_1d0);
  boost::algorithm::to_upper_copy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 8),
             (algorithm *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,in_RCX);
  std::operator<<(local_198,(string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::locale::~locale((locale *)local_1d0);
  local_1e8._M_node =
       (_Base_ptr)
       std::
       multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
       ::begin(local_20);
  while( true ) {
    key.field_2._8_8_ =
         std::
         multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
         ::end(local_20);
    bVar2 = std::operator!=(&local_1e8,(_Self *)((long)&key.field_2 + 8));
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
             ::operator->(&local_1e8);
    pcVar1 = (ppVar3->first).pItem;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_210,pcVar1,&local_211);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_210,"sig");
    if (bVar2) {
      std::locale::locale((locale *)local_240);
      boost::algorithm::trim_copy<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_240 + 8),(algorithm *)local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 in_RCX);
      poVar4 = std::operator<<(local_198,(string *)(local_240 + 8));
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
               ::operator->(&local_1e8);
      pcVar1 = ppVar3->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,pcVar1,(allocator *)(local_290 + 0xf));
      std::locale::locale((locale *)local_290);
      boost::algorithm::trim_copy<std::__cxx11::string>
                (&local_260,(algorithm *)local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 in_RCX);
      std::operator<<(poVar4,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::locale::~locale((locale *)local_290);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)(local_290 + 0xf));
      std::__cxx11::string::~string((string *)(local_240 + 8));
      std::locale::~locale((locale *)local_240);
    }
    std::__cxx11::string::~string((string *)local_210);
    std::
    _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
    ::operator++(&local_1e8,0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static const string print_for_sign(const string &feature_name, const CSimpleIniA::TKeyVal *section) {
	stringstream buf;
	buf << boost::to_upper_copy(feature_name);
	for (auto it = section->begin(); it != section->end(); it++) {
		string key(it->first.pItem);
		if (key != LICENSE_SIGNATURE) {
			buf << boost::algorithm::trim_copy(key) << boost::algorithm::trim_copy(string(it->second));
		}
	}
	return buf.str();
}